

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O2

UBool uhash_compareUChars_63(UHashTok key1,UHashTok key2)

{
  short sVar1;
  long lVar2;
  UChar *p2;
  UChar *p1;
  
  if (key1.pointer == key2.pointer) {
    return '\x01';
  }
  if (key2.pointer == (void *)0x0 || key1.pointer == (void *)0x0) {
    return '\0';
  }
  lVar2 = 0;
  while( true ) {
    sVar1 = *(short *)((long)key1.pointer + lVar2);
    if ((sVar1 == 0) || (sVar1 != *(short *)((long)key2.pointer + lVar2))) break;
    lVar2 = lVar2 + 2;
  }
  return sVar1 == *(short *)((long)key2.pointer + lVar2);
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareUChars(const UHashTok key1, const UHashTok key2) {
    const UChar *p1 = (const UChar*) key1.pointer;
    const UChar *p2 = (const UChar*) key2.pointer;
    if (p1 == p2) {
        return TRUE;
    }
    if (p1 == NULL || p2 == NULL) {
        return FALSE;
    }
    while (*p1 != 0 && *p1 == *p2) {
        ++p1;
        ++p2;
    }
    return (UBool)(*p1 == *p2);
}